

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O2

Type * anon_unknown.dwarf_4b8b83::synonymizedType(SemanticModel *semaModel,Type *ty)

{
  TypeKind TVar1;
  TypedefNameType *pTVar2;
  TypedefDeclarationSymbol *pTVar3;
  Type *pTVar4;
  
  TVar1 = psy::C::Type::kind((Type *)semaModel);
  if (TVar1 == TypedefName) {
    pTVar2 = (TypedefNameType *)
             (**(code **)((long)&((semaModel->impl_)._M_t.
                                  super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                                  .
                                  super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>
                                 ._M_head_impl)->tys_ + 0x20))(semaModel);
    pTVar3 = psy::C::TypedefNameType::declaration(pTVar2);
    if (pTVar3 != (TypedefDeclarationSymbol *)0x0) {
      pTVar2 = (TypedefNameType *)
               (**(code **)((long)&((semaModel->impl_)._M_t.
                                    super___uniq_ptr_impl<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
                                    .
                                    super__Head_base<0UL,_psy::C::SemanticModel::SemanticModelImpl_*,_false>
                                   ._M_head_impl)->tys_ + 0x20))(semaModel);
      pTVar3 = psy::C::TypedefNameType::declaration(pTVar2);
      pTVar4 = psy::C::TypedefDeclarationSymbol::synonymizedType(pTVar3);
      if (pTVar4 != (Type *)0x0) {
        return pTVar4;
      }
    }
  }
  return (Type *)semaModel;
}

Assistant:

const Type* synonymizedType(const SemanticModel* semaModel, const Type* ty)
{
    if (ty->kind() == TypeKind::TypedefName
            && ty->asTypedefNameType()->declaration()) {
        auto actualTy = ty->asTypedefNameType()->declaration()->synonymizedType();
        if (actualTy)
            return actualTy;
    }
    return ty;
}